

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnHelper::WriteColumns
          (ColumnHelper *this,idx_t start_index,idx_t start_col,idx_t end_col,DataChunk *output)

{
  pointer pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  string *psVar6;
  idx_t val;
  long lVar7;
  undefined4 extraout_var_00;
  LogicalType *this_00;
  LogicalType *this_01;
  Value numeric_precision;
  Value numeric_precision_radix;
  Value numeric_scale;
  Value local_298;
  idx_t local_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  Value local_1d0;
  string local_190;
  Value local_170;
  LogicalType local_130;
  LogicalType local_118;
  LogicalType local_100;
  LogicalType local_e8;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  LogicalType local_88;
  Value local_70;
  long lVar5;
  undefined4 extraout_var_01;
  
  if (start_col < end_col) {
    local_258 = end_col;
    do {
      iVar4 = (*this->_vptr_ColumnHelper[2])();
      lVar5 = CONCAT44(extraout_var,iVar4);
      psVar6 = Catalog::GetName_abi_cxx11_(*(Catalog **)(lVar5 + 0xd8));
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar1,pcVar1 + psVar6->_M_string_length);
      Value::Value(&local_298,&local_250);
      DataChunk::SetValue(output,0,start_index,&local_298);
      Value::~Value(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      val = Catalog::GetOid(*(Catalog **)(lVar5 + 0xd8));
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      Value::BIGINT(&local_298,lVar7);
      DataChunk::SetValue(output,1,start_index,&local_298);
      Value::~Value(&local_298);
      lVar7 = *(long *)(*(long *)(lVar5 + 0xe0) + 0x20);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,lVar7,*(long *)(*(long *)(lVar5 + 0xe0) + 0x28) + lVar7);
      Value::Value(&local_298,&local_1f0);
      DataChunk::SetValue(output,2,start_index,&local_298);
      Value::~Value(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        (*(unsigned_long *)(*(long *)(lVar5 + 0xe0) + 8));
      Value::BIGINT(&local_298,lVar7);
      DataChunk::SetValue(output,3,start_index,&local_298);
      Value::~Value(&local_298);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,*(long *)(lVar5 + 0x20),
                 *(long *)(lVar5 + 0x28) + *(long *)(lVar5 + 0x20));
      Value::Value(&local_298,&local_210);
      DataChunk::SetValue(output,4,start_index,&local_298);
      Value::~Value(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(*(unsigned_long *)(lVar5 + 8));
      Value::BIGINT(&local_298,lVar7);
      DataChunk::SetValue(output,5,start_index,&local_298);
      Value::~Value(&local_298);
      iVar4 = (*this->_vptr_ColumnHelper[4])(this,start_col);
      lVar7 = *(long *)CONCAT44(extraout_var_00,iVar4);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,lVar7,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar7);
      Value::Value(&local_298,&local_230);
      DataChunk::SetValue(output,6,start_index,&local_298);
      Value::~Value(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      Value::INTEGER(&local_298,(int)start_col + 1);
      DataChunk::SetValue(output,7,start_index,&local_298);
      Value::~Value(&local_298);
      (*this->_vptr_ColumnHelper[8])(&local_298,this,start_col);
      DataChunk::SetValue(output,8,start_index,&local_298);
      Value::~Value(&local_298);
      Value::BOOLEAN(&local_298,*(bool *)(lVar5 + 0x42));
      DataChunk::SetValue(output,9,start_index,&local_298);
      Value::~Value(&local_298);
      (*this->_vptr_ColumnHelper[6])(&local_298,this,start_col);
      DataChunk::SetValue(output,10,start_index,&local_298);
      Value::~Value(&local_298);
      iVar4 = (*this->_vptr_ColumnHelper[7])(this,start_col);
      Value::BOOLEAN(&local_298,SUB41(iVar4,0));
      DataChunk::SetValue(output,0xb,start_index,&local_298);
      Value::~Value(&local_298);
      iVar4 = (*this->_vptr_ColumnHelper[5])(this,start_col);
      this_00 = (LogicalType *)CONCAT44(extraout_var_01,iVar4);
      LogicalType::ToString_abi_cxx11_(&local_190,this_00);
      Value::Value(&local_298,&local_190);
      DataChunk::SetValue(output,0xc,start_index,&local_298);
      Value::~Value(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      Value::BIGINT(&local_298,(ulong)this_00->id_);
      DataChunk::SetValue(output,0xd,start_index,&local_298);
      Value::~Value(&local_298);
      LogicalType::LogicalType(&local_298.type_,VARCHAR);
      bVar2 = LogicalType::operator==(this_00,&local_298.type_);
      LogicalType::~LogicalType(&local_298.type_);
      if (bVar2) {
        LogicalType::LogicalType(&local_100,SQLNULL);
        Value::Value(&local_298,&local_100);
        DataChunk::SetValue(output,0xe,start_index,&local_298);
        Value::~Value(&local_298);
        this_01 = &local_100;
      }
      else {
        LogicalType::LogicalType(&local_118,SQLNULL);
        Value::Value(&local_298,&local_118);
        DataChunk::SetValue(output,0xe,start_index,&local_298);
        Value::~Value(&local_298);
        this_01 = &local_118;
      }
      LogicalType::~LogicalType(this_01);
      LogicalType::LogicalType(&local_130,SQLNULL);
      Value::Value(&local_298,&local_130);
      LogicalType::~LogicalType(&local_130);
      LogicalType::LogicalType(&local_88,SQLNULL);
      Value::Value(&local_70,&local_88);
      LogicalType::~LogicalType(&local_88);
      LogicalType::LogicalType(&local_a0,SQLNULL);
      Value::Value(&local_1d0,&local_a0);
      LogicalType::~LogicalType(&local_a0);
      switch(this_00->id_) {
      case TINYINT:
        Value::INTEGER(&local_170,8);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      case SMALLINT:
        Value::INTEGER(&local_170,0x10);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      case INTEGER:
        Value::INTEGER(&local_170,0x20);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      case BIGINT:
        Value::INTEGER(&local_170,0x40);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      case DATE:
      case TIME:
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
switchD_00a1f743_caseD_f:
        LogicalType::LogicalType(&local_b8,SQLNULL);
        Value::Value(&local_170,&local_b8);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        LogicalType::~LogicalType(&local_b8);
        LogicalType::LogicalType(&local_d0,SQLNULL);
        Value::Value(&local_170,&local_d0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        LogicalType::~LogicalType(&local_d0);
        LogicalType::LogicalType(&local_e8,SQLNULL);
        Value::Value(&local_170,&local_e8);
        Value::operator=(&local_1d0,&local_170);
        Value::~Value(&local_170);
        LogicalType::~LogicalType(&local_e8);
        goto LAB_00a1fb0e;
      case DECIMAL:
        bVar3 = DecimalType::GetWidth(this_00);
        Value::INTEGER(&local_170,(uint)bVar3);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        bVar3 = DecimalType::GetScale(this_00);
        Value::INTEGER(&local_170,(uint)bVar3);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,10);
        Value::operator=(&local_1d0,&local_170);
        goto LAB_00a1fb09;
      case FLOAT:
        Value::INTEGER(&local_170,0x18);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      case DOUBLE:
        Value::INTEGER(&local_170,0x35);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
        break;
      default:
        if (this_00->id_ != HUGEINT) goto switchD_00a1f743_caseD_f;
        Value::INTEGER(&local_170,0x80);
        Value::operator=(&local_298,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,0);
        Value::operator=(&local_70,&local_170);
        Value::~Value(&local_170);
        Value::INTEGER(&local_170,2);
      }
      Value::operator=(&local_1d0,&local_170);
LAB_00a1fb09:
      Value::~Value(&local_170);
LAB_00a1fb0e:
      DataChunk::SetValue(output,0xf,start_index,&local_298);
      DataChunk::SetValue(output,0x10,start_index,&local_1d0);
      DataChunk::SetValue(output,0x11,start_index,&local_70);
      Value::~Value(&local_1d0);
      Value::~Value(&local_70);
      Value::~Value(&local_298);
      start_index = start_index + 1;
      start_col = start_col + 1;
    } while (start_col != local_258);
  }
  return;
}

Assistant:

void ColumnHelper::WriteColumns(idx_t start_index, idx_t start_col, idx_t end_col, DataChunk &output) {
	for (idx_t i = start_col; i < end_col; i++) {
		auto index = start_index + (i - start_col);
		auto &entry = Entry();

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, index, entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, index, entry.schema.name);
		// schema_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.schema.oid)));
		// table_name, VARCHAR
		output.SetValue(col++, index, entry.name);
		// table_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.oid)));
		// column_name, VARCHAR
		output.SetValue(col++, index, Value(ColumnName(i)));
		// column_index, INTEGER
		output.SetValue(col++, index, Value::INTEGER(UnsafeNumericCast<int32_t>(i + 1)));
		// comment, VARCHAR
		output.SetValue(col++, index, ColumnComment(i));
		// internal, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(entry.internal));
		// column_default, VARCHAR
		output.SetValue(col++, index, Value(ColumnDefault(i)));
		// is_nullable, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(IsNullable(i)));
		// data_type, VARCHAR
		const LogicalType &type = ColumnType(i);
		output.SetValue(col++, index, Value(type.ToString()));
		// data_type_id, BIGINT
		output.SetValue(col++, index, Value::BIGINT(int(type.id())));
		if (type == LogicalType::VARCHAR) {
			// FIXME: need check constraints in place to set this correctly
			// character_maximum_length, INTEGER
			output.SetValue(col++, index, Value());
		} else {
			// "character_maximum_length", PhysicalType::INTEGER
			output.SetValue(col++, index, Value());
		}

		Value numeric_precision, numeric_scale, numeric_precision_radix;
		switch (type.id()) {
		case LogicalTypeId::DECIMAL:
			numeric_precision = Value::INTEGER(DecimalType::GetWidth(type));
			numeric_scale = Value::INTEGER(DecimalType::GetScale(type));
			numeric_precision_radix = Value::INTEGER(10);
			break;
		case LogicalTypeId::HUGEINT:
			numeric_precision = Value::INTEGER(128);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::BIGINT:
			numeric_precision = Value::INTEGER(64);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::INTEGER:
			numeric_precision = Value::INTEGER(32);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::SMALLINT:
			numeric_precision = Value::INTEGER(16);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::TINYINT:
			numeric_precision = Value::INTEGER(8);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::FLOAT:
			numeric_precision = Value::INTEGER(24);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::DOUBLE:
			numeric_precision = Value::INTEGER(53);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		default:
			numeric_precision = Value();
			numeric_scale = Value();
			numeric_precision_radix = Value();
			break;
		}

		// numeric_precision, INTEGER
		output.SetValue(col++, index, numeric_precision);
		// numeric_precision_radix, INTEGER
		output.SetValue(col++, index, numeric_precision_radix);
		// numeric_scale, INTEGER
		output.SetValue(col++, index, numeric_scale);
	}
}